

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxskin.cpp
# Opt level: O3

Stream * rw::xbox::writeNativeSkin(Stream *stream,int32 len,void *object,int32 offset)

{
  Skin *skin;
  void *data;
  
  skin = *(Skin **)((long)object + (long)offset);
  data = skin->platformData;
  writeChunkHeader(stream,1,len + -0xc);
  Stream::writeU32(stream,5);
  Stream::writeI32(stream,skin->numBones);
  Stream::write32(stream,data,0x400);
  Stream::write32(stream,(void *)((long)data + 0x400),0x400);
  Stream::writeI32(stream,*(int32 *)((long)data + 0x800));
  Stream::writeI32(stream,skin->numWeights);
  Stream::writeU32(stream,0xbadeaffe);
  Stream::writeI32(stream,*(int32 *)((long)data + 0x810));
  (*stream->_vptr_Stream[3])
            (stream,*(undefined8 *)((long)data + 0x808),
             (ulong)(uint)(*(int *)((long)data + 0x810) * *(int *)((long)object + 0x1c)));
  Stream::write32(stream,skin->inverseMatrices,skin->numBones << 6);
  writeSkinSplitData(stream,skin);
  return stream;
}

Assistant:

Stream*
writeNativeSkin(Stream *stream, int32 len, void *object, int32 offset)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	assert(skin->platformData);
	assert(rw::version >= 0x35000 && "can't handle native xbox skin < 0x35000");
	NativeSkin *natskin = (NativeSkin*)skin->platformData;

	writeChunkHeader(stream, ID_STRUCT, len-12);
	stream->writeU32(PLATFORM_XBOX);
	stream->writeI32(skin->numBones);
	stream->write32(natskin->table1, 256*sizeof(int32));
	stream->write32(natskin->table2, 256*sizeof(int32));
	stream->writeI32(natskin->numUsedBones);
	stream->writeI32(skin->numWeights);
	stream->writeU32(0xBADEAFFE);	// pointer to vertexBuffer
	stream->writeI32(natskin->stride);
	stream->write8(natskin->vertexBuffer,
	              geometry->numVertices*natskin->stride);
	stream->write32(skin->inverseMatrices, skin->numBones*64);

	writeSkinSplitData(stream, skin);
	return stream;
}